

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O0

void lts2::PerformRIHTOnImageFAST
               (Mat *anImage,Size *patchSize,LBDOperator *LBD,Mat *result,int iterations,
               float sparsity,float patchMean)

{
  float sparsityCoeff;
  float iterations_00;
  _InputArray *p_Var1;
  Mat *LBD_00;
  bool bVar2;
  int iVar3;
  pointer pKVar4;
  double *pdVar5;
  float fVar6;
  undefined1 auVar7 [12];
  Mat local_620 [96];
  Mat local_5c0 [8];
  Mat target;
  allocator local_559;
  string local_558 [32];
  Size_<int> local_538;
  _InputArray local_530;
  undefined1 local_518 [8];
  Scalar mean;
  undefined1 local_4f0 [4];
  float pmean;
  _OutputArray local_4d8 [4];
  undefined1 local_478 [8];
  Rect ROI;
  int y;
  int x;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_458;
  KeyPoint *local_450;
  __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_448;
  const_iterator p_fast;
  int pradius_y;
  int pradius_x;
  Mat resultPatch;
  Mat local_3d8 [8];
  Mat freak;
  Mat local_378 [8];
  Mat inputPatch;
  Size_<int> local_318;
  MatExpr local_310 [352];
  MatExpr local_1b0 [8];
  Mat patchOnes;
  Scalar_<double> local_150;
  MatSize local_130 [8];
  undefined1 local_128 [8];
  Mat ocount;
  Scalar_<double> local_c8;
  _InputArray local_a8;
  MatSize local_90 [8];
  undefined1 local_88 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> fastPoints;
  allocator local_59;
  string local_58 [36];
  float local_34;
  float local_30;
  float patchMean_local;
  float sparsity_local;
  int iterations_local;
  Mat *result_local;
  LBDOperator *LBD_local;
  Size *patchSize_local;
  Mat *anImage_local;
  
  local_34 = patchMean;
  local_30 = sparsity;
  patchMean_local = (float)iterations;
  _sparsity_local = (_InputArray *)result;
  result_local = (Mat *)LBD;
  LBD_local = (LBDOperator *)patchSize;
  patchSize_local = (Size *)anImage;
  iVar3 = cv::Mat::type(anImage);
  if ((iVar3 == 5) && (iVar3 = cv::Mat::channels((Mat *)patchSize_local), iVar3 == 1)) {
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_88);
    ExtractFastKeypoints
              ((Mat *)patchSize_local,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_88);
    p_Var1 = _sparsity_local;
    cv::MatSize::operator()(local_90);
    cv::Mat::create(p_Var1,local_90,5);
    p_Var1 = _sparsity_local;
    cv::Scalar_<double>::Scalar_(&local_c8,0.0);
    cv::_InputArray::_InputArray<double,4,1>(&local_a8,(Matx<double,_4,_1> *)&local_c8);
    cv::noArray();
    cv::Mat::setTo(p_Var1,&local_a8);
    cv::_InputArray::~_InputArray(&local_a8);
    cv::MatSize::operator()(local_130);
    cv::Scalar_<double>::Scalar_(&local_150,0.0);
    cv::Mat::Mat((Mat *)local_128,local_130,5,&local_150);
    cv::Size_<int>::Size_(&local_318,patchSize);
    cv::Mat::ones(local_310,&local_318,5);
    cv::MatExpr::operator_cast_to_Mat(local_1b0);
    cv::MatExpr::~MatExpr(local_310);
    cv::Mat::Mat(local_378);
    cv::Mat::Mat(local_3d8);
    cv::Mat::Mat((Mat *)&pradius_y);
    p_fast._M_current._4_4_ = patchSize->width / 2;
    p_fast._M_current._0_4_ = patchSize->height / 2;
    __gnu_cxx::
    __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
    ::__normal_iterator(&local_448);
    local_458._M_current =
         (KeyPoint *)
         std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                   ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_88);
    __gnu_cxx::
    __normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>::
    __normal_iterator<cv::KeyPoint*>
              ((__normal_iterator<cv::KeyPoint_const*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>
                *)&local_450,&local_458);
    local_448._M_current = local_450;
    while( true ) {
      _y = std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end
                     ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_88);
      bVar2 = __gnu_cxx::operator!=
                        (&local_448,
                         (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                          *)&y);
      if (!bVar2) break;
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator->(&local_448);
      fVar6 = rintf(*(float *)pKVar4);
      ROI.height = (int)fVar6 - p_fast._M_current._4_4_;
      pKVar4 = __gnu_cxx::
               __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator->(&local_448);
      fVar6 = rintf(*(float *)(pKVar4 + 4));
      ROI.width = (int)fVar6 - (int)p_fast._M_current;
      cv::Rect_<int>::Rect_
                ((Rect_<int> *)local_478,ROI.height,ROI.width,patchSize->width,patchSize->height);
      if ((((-1 < ROI.width) && (ROI.width + patchSize->height <= patchSize_local[1].width)) &&
          (-1 < ROI.height)) && (ROI.height + patchSize->width <= patchSize_local[1].height)) {
        cv::Mat::operator()((Mat *)local_4d8,(Rect *)patchSize_local);
        cv::_OutputArray::_OutputArray((_OutputArray *)local_4f0,local_378);
        cv::Mat::copyTo(local_4d8);
        cv::_OutputArray::~_OutputArray((_OutputArray *)local_4f0);
        cv::Mat::~Mat((Mat *)local_4d8);
        mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = local_34;
        if (local_34 < 0.0) {
          cv::_InputArray::_InputArray(&local_530,local_378);
          cv::noArray();
          cv::mean((_InputArray *)local_518,&local_530);
          cv::_InputArray::~_InputArray(&local_530);
          pdVar5 = cv::Vec<double,_4>::operator[]((Vec<double,_4> *)local_518,0);
          mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_ = (float)*pdVar5;
        }
        (**(code **)(*(long *)result_local + 0x10))(result_local,local_378,local_3d8);
        LBD_00 = result_local;
        iterations_00 = patchMean_local;
        sparsityCoeff = local_30;
        cv::Size_<int>::Size_(&local_538,patchSize);
        fVar6 = mean.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3]._4_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_558,"haar",&local_559);
        RealReconstructionWithIHT
                  ((Mat *)&pradius_y,(LBDOperator *)LBD_00,local_3d8,(int)iterations_00,
                   sparsityCoeff,&local_538,fVar6,2,(string *)local_558);
        std::__cxx11::string::~string(local_558);
        std::allocator<char>::~allocator((allocator<char> *)&local_559);
        cv::Mat::operator()(local_5c0,(Rect *)_sparsity_local);
        cv::operator+=(local_5c0,(Mat *)&pradius_y);
        cv::Mat::operator()(local_620,(Rect *)local_128);
        cv::Mat::operator=(local_5c0,local_620);
        cv::Mat::~Mat(local_620);
        cv::operator+=(local_5c0,(Mat *)local_1b0);
        cv::Mat::~Mat(local_5c0);
      }
      __gnu_cxx::
      __normal_iterator<const_cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
      ::operator++(&local_448);
    }
    finalize((Mat *)_sparsity_local,(Mat *)local_128);
    cv::Mat::~Mat((Mat *)&pradius_y);
    cv::Mat::~Mat(local_3d8);
    cv::Mat::~Mat(local_378);
    cv::Mat::~Mat((Mat *)local_1b0);
    cv::Mat::~Mat((Mat *)local_128);
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_88);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"anImage.type() == CV_32F && anImage.channels() == 1",&local_59);
  auVar7 = cv::error(-0xd7,local_58,"PerformRIHTOnImageFAST",
                     "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/reconstruction.cpp"
                     ,0x3a3);
  fastPoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = auVar7._8_4_;
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  _Unwind_Resume(auVar7._0_8_);
}

Assistant:

void lts2::PerformRIHTOnImageFAST(cv::Mat const &anImage, cv::Size patchSize,
                                 LBDOperator &LBD, cv::Mat &result, int iterations, float sparsity, float patchMean)
{
  CV_Assert(anImage.type() == CV_32F && anImage.channels() == 1);
  
  // Extract FAST keypoints
  std::vector<cv::KeyPoint> fastPoints;
  ExtractFastKeypoints(anImage, fastPoints);
  
  // Result image
  result.create(anImage.size(), CV_32F);
  result.setTo(cv::Scalar(0));
  
  cv::Mat ocount(anImage.size(), CV_32FC1, cv::Scalar(0));
  cv::Mat patchOnes = cv::Mat::ones(patchSize, CV_32FC1);
  
  // Loop over the patches
  cv::Mat inputPatch, freak;
  cv::Mat resultPatch;
  int const pradius_x = patchSize.width / 2;
  int const pradius_y = patchSize.height / 2;
  
  std::vector<cv::KeyPoint>::const_iterator p_fast;

  for (p_fast = fastPoints.begin(); p_fast != fastPoints.end(); ++p_fast)
  {
    int x = (int)rintf(p_fast->pt.x) - pradius_x;
    int y = (int)rintf(p_fast->pt.y) - pradius_y;
    
    cv::Rect ROI(x, y, patchSize.width, patchSize.height);
    if ( y < 0 || y+patchSize.height > anImage.rows ||
         x < 0 || x+patchSize.width > anImage.cols )
      continue;

    anImage(ROI).copyTo(inputPatch);
    float pmean = patchMean;
    if (pmean < 0.0)
    {
      cv::Scalar mean = cv::mean(inputPatch);
      pmean = (float)mean[0];
    }

    LBD.Apply(inputPatch, freak);

    lts2::RealReconstructionWithIHT(resultPatch, LBD, freak,
                                    iterations, sparsity, patchSize, pmean);

    cv::Mat target = result(ROI);
    target += resultPatch;

    target = ocount(ROI);
    target += patchOnes;
  }
  
  finalize(result, ocount);
}